

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512-sw.c
# Opt level: O2

void sha512_sw_round(uint round_index,uint64_t *schedule,uint64_t *a,uint64_t *b,uint64_t *c,
                    uint64_t *d,uint64_t *e,uint64_t *f,uint64_t *g,uint64_t *h)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = *e;
  uVar2 = *a;
  uVar3 = *b;
  lVar4 = ((uVar1 << 0x17 | uVar1 >> 0x29) ^
          (uVar1 << 0x2e | uVar1 >> 0x12) ^ (uVar1 << 0x32 | uVar1 >> 0xe)) + *h +
          sha512_round_constants[round_index] + schedule[round_index] + ((*f ^ *g) & uVar1 ^ *g);
  uVar1 = *c;
  *d = *d + lVar4;
  *h = ((uVar3 | uVar2) & uVar1 | uVar3 & uVar2) +
       ((uVar2 << 0x19 | uVar2 >> 0x27) ^
       (uVar2 << 0x1e | uVar2 >> 0x22) ^ (uVar2 << 0x24 | uVar2 >> 0x1c)) + lVar4;
  return;
}

Assistant:

static inline void sha512_sw_round(
    unsigned round_index, const uint64_t *schedule,
    uint64_t *a, uint64_t *b, uint64_t *c, uint64_t *d,
    uint64_t *e, uint64_t *f, uint64_t *g, uint64_t *h)
{
    uint64_t t1 = *h + Sigma_1(*e) + Ch(*e,*f,*g) +
        sha512_round_constants[round_index] + schedule[round_index];

    uint64_t t2 = Sigma_0(*a) + Maj(*a,*b,*c);

    *d += t1;
    *h = t1 + t2;
}